

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseName(Db *this,NameState *State)

{
  char *pcVar1;
  byte *pbVar2;
  int iVar3;
  short *psVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *pbVar7;
  Node **ppNVar8;
  bool bVar9;
  Qualifiers QVar10;
  Node *pNVar11;
  short *psVar12;
  Node *pNVar13;
  char *pcVar14;
  NameType *pNVar15;
  NameType *pNVar16;
  NameType *pNVar17;
  Node *pNVar18;
  FunctionRefQual FVar19;
  ulong uVar20;
  char cVar21;
  Node *N;
  NameType *local_50;
  BumpPointerAllocator *local_48;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *local_40;
  NameType *local_38;
  
  psVar12 = (short *)this->First;
  psVar4 = (short *)this->Last;
  if ((psVar12 != psVar4) && ((char)*psVar12 == 'L')) {
    this->First = (char *)((long)psVar12 + 1);
  }
  psVar12 = (short *)this->First;
  if (psVar4 != psVar12) {
    cVar21 = (char)*psVar12;
    if (cVar21 == 'Z') {
      this->First = (char *)((long)psVar12 + 1);
      pNVar18 = parseEncoding(this);
      if (pNVar18 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar14 = this->First;
      pcVar5 = this->Last;
      if (pcVar14 == pcVar5) {
        return (Node *)0x0;
      }
      if (*pcVar14 != 'E') {
        return (Node *)0x0;
      }
      pcVar1 = pcVar14 + 1;
      this->First = pcVar1;
      if (pcVar1 != pcVar5) {
        if (*pcVar1 == 's') {
          this->First = pcVar14 + 2;
          pcVar14 = parse_discriminator(pcVar14 + 2,pcVar5);
          this->First = pcVar14;
          pNVar17 = (anonymous_namespace)::Db::
                    make<(anonymous_namespace)::NameType,char_const(&)[15]>
                              ((Db *)this,(char (*) [15])"string literal");
          goto LAB_00199760;
        }
        if ((pcVar1 != pcVar5) && (*pcVar1 == 'd')) {
          this->First = pcVar14 + 2;
          parseNumber(this,true);
          pcVar14 = this->First;
          if (pcVar14 == this->Last) {
            return (Node *)0x0;
          }
          if (*pcVar14 != '_') {
            return (Node *)0x0;
          }
          this->First = pcVar14 + 1;
          pNVar17 = (NameType *)parseName(this,State);
          if (pNVar17 == (NameType *)0x0) {
            return (Node *)0x0;
          }
          goto LAB_00199760;
        }
      }
      pNVar17 = (NameType *)parseName(this,State);
      if (pNVar17 == (NameType *)0x0) {
        return (Node *)0x0;
      }
      pcVar14 = parse_discriminator(this->First,this->Last);
      this->First = pcVar14;
LAB_00199760:
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar13->K = KLocalName;
      pNVar13->RHSComponentCache = No;
      pNVar13->ArrayCache = No;
      pNVar13->FunctionCache = No;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb520;
      pNVar13[1]._vptr_Node = (_func_int **)pNVar18;
      *(NameType **)&pNVar13[1].K = pNVar17;
      return pNVar13;
    }
    if (cVar21 == 'S') {
      if (((ulong)((long)psVar4 - (long)psVar12) < 2) || (*(char *)((long)psVar12 + 1) != 't')) {
        pNVar18 = parseSubstitution(this);
        if (pNVar18 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (this->Last == this->First) {
          return (Node *)0x0;
        }
        if (*this->First != 'I') {
          return (Node *)0x0;
        }
        pNVar13 = parseTemplateArgs(this,State != (NameState *)0x0);
        if (pNVar13 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (State != (NameState *)0x0) {
          State->EndsWithTemplateArgs = true;
        }
        pNVar11 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar11->K = KNameWithTemplateArgs;
        pNVar11->RHSComponentCache = No;
        pNVar11->ArrayCache = No;
        pNVar11->FunctionCache = No;
        pNVar11->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb680;
        pNVar11[1]._vptr_Node = (_func_int **)pNVar18;
        *(Node **)&pNVar11[1].K = pNVar13;
        return pNVar11;
      }
    }
    else if (cVar21 == 'N') {
      this->First = (char *)((long)psVar12 + 1);
      QVar10 = parseCVQualifiers(this);
      if (State != (NameState *)0x0) {
        State->CVQualifiers = QVar10;
      }
      pcVar14 = this->First;
      pcVar5 = this->Last;
      if (pcVar14 == pcVar5) {
LAB_00199242:
        if (State == (NameState *)0x0) goto LAB_0019924d;
        FVar19 = FrefQualNone;
      }
      else {
        if (*pcVar14 == 'O') {
          this->First = pcVar14 + 1;
          FVar19 = FrefQualRValue;
        }
        else {
          if ((pcVar14 == pcVar5) || (*pcVar14 != 'R')) goto LAB_00199242;
          this->First = pcVar14 + 1;
          FVar19 = FrefQualLValue;
        }
        if (State == (NameState *)0x0) goto LAB_0019924d;
      }
      State->ReferenceQualifier = FVar19;
LAB_0019924d:
      local_50 = (NameType *)0x0;
      psVar12 = (short *)this->First;
      if ((1 < (ulong)((long)pcVar5 - (long)psVar12)) && (*psVar12 == 0x7453)) {
        this->First = (char *)(psVar12 + 1);
        local_50 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[4]>
                             ((Db *)this,(char (*) [4])"std");
      }
      local_48 = &this->ASTAllocator;
      local_40 = &this->Subs;
      pNVar17 = local_50;
LAB_001992a8:
      do {
        while( true ) {
          pcVar14 = this->First;
          pcVar5 = this->Last;
          while( true ) {
            if (pcVar14 != pcVar5) {
              if (*pcVar14 == 'E') {
                this->First = pcVar14 + 1;
                if (local_50 == (NameType *)0x0) {
                  return (Node *)0x0;
                }
                ppNVar8 = (this->Subs).Last;
                if ((this->Subs).First == ppNVar8) {
                  return (Node *)0x0;
                }
                (this->Subs).Last = ppNVar8 + -1;
                return &local_50->super_Node;
              }
              if ((pcVar14 != pcVar5) && (*pcVar14 == 'L')) {
                pcVar14 = pcVar14 + 1;
                this->First = pcVar14;
              }
            }
            if ((pcVar14 == pcVar5) || (*pcVar14 != 'M')) break;
            pcVar14 = pcVar14 + 1;
            this->First = pcVar14;
            if (pNVar17 == (NameType *)0x0) {
              return (Node *)0x0;
            }
          }
          uVar20 = (long)pcVar5 - (long)pcVar14;
          if (pcVar5 != pcVar14) break;
LAB_001993ee:
          pNVar15 = (NameType *)parseUnqualifiedName(this,State);
LAB_001993f9:
          if (pNVar15 == (NameType *)0x0) {
            return (Node *)0x0;
          }
          if (pNVar17 != (NameType *)0x0) {
            pNVar16 = (NameType *)BumpPointerAllocator::allocate(local_48,0x20);
            (pNVar16->super_Node).K = KNestedName;
            (pNVar16->super_Node).RHSComponentCache = No;
            (pNVar16->super_Node).ArrayCache = No;
            (pNVar16->super_Node).FunctionCache = No;
            (pNVar16->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ea7b8;
            (pNVar16->Name).First = (char *)pNVar17;
            (pNVar16->Name).Last = (char *)pNVar15;
            pNVar15 = pNVar16;
          }
          local_50 = pNVar15;
          if (State != (NameState *)0x0) {
            State->EndsWithTemplateArgs = false;
          }
LAB_00199449:
          pNVar17 = local_50;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                    (local_40,(Node **)&local_50);
        }
        cVar21 = *pcVar14;
        if (cVar21 == 'I') {
          pNVar18 = parseTemplateArgs(this,State != (NameState *)0x0);
          if (pNVar18 == (Node *)0x0) {
            return (Node *)0x0;
          }
          if (pNVar17 == (NameType *)0x0) {
            return (Node *)0x0;
          }
          pNVar15 = (NameType *)BumpPointerAllocator::allocate(local_48,0x20);
          (pNVar15->super_Node).K = KNameWithTemplateArgs;
          (pNVar15->super_Node).RHSComponentCache = No;
          (pNVar15->super_Node).ArrayCache = No;
          (pNVar15->super_Node).FunctionCache = No;
          (pNVar15->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb680;
          (pNVar15->Name).First = (char *)pNVar17;
          (pNVar15->Name).Last = (char *)pNVar18;
          if (State != (NameState *)0x0) {
            State->EndsWithTemplateArgs = true;
          }
          local_50 = pNVar15;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                    (local_40,(Node **)&local_50);
          pNVar17 = pNVar15;
          goto LAB_001992a8;
        }
        if (cVar21 == 'T') {
          pNVar15 = (NameType *)parseTemplateParam(this);
          goto LAB_001993f9;
        }
        if ((1 < uVar20 && cVar21 == 'D') && ((byte)(pcVar14[1] | 0x20U) == 0x74)) {
          pNVar15 = (NameType *)parseDecltype(this);
          goto LAB_001993f9;
        }
        if (cVar21 == 'C') {
LAB_0019945b:
          if (pNVar17 == (NameType *)0x0) {
            return (Node *)0x0;
          }
          if (((pNVar17->super_Node).K == KSpecialSubstitution) &&
             (iVar3 = *(int *)&(pNVar17->super_Node).field_0xc, iVar3 - 2U < 4)) {
            pNVar17 = (NameType *)BumpPointerAllocator::allocate(local_48,0x10);
            (pNVar17->super_Node).K = KExpandedSpecialSubstitution;
            (pNVar17->super_Node).RHSComponentCache = No;
            (pNVar17->super_Node).ArrayCache = No;
            (pNVar17->super_Node).FunctionCache = No;
            (pNVar17->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb310;
            *(int *)&(pNVar17->super_Node).field_0xc = iVar3;
            local_50 = pNVar17;
          }
          pbVar6 = (byte *)this->First;
          pbVar7 = (byte *)this->Last;
          if (pbVar6 == pbVar7) {
LAB_001995f6:
            pcVar14 = (char *)0x0;
          }
          else {
            if (*pbVar6 == 0x43) {
              pbVar2 = pbVar6 + 1;
              this->First = (char *)pbVar2;
              if ((pbVar2 == pbVar7) || (*pbVar2 != 0x49)) {
                bVar9 = false;
              }
              else {
                this->First = (char *)(pbVar6 + 2);
                bVar9 = true;
              }
              pbVar6 = (byte *)this->First;
              if ((pbVar7 != pbVar6) && ((ulong)*pbVar6 < 0x36)) {
                pcVar14 = (char *)0x0;
                if ((0x2e000000000000U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0) {
                  this->First = (char *)(pbVar6 + 1);
                  if (State != (NameState *)0x0) {
                    State->CtorDtorConversion = true;
                  }
                  if (bVar9) {
                    pNVar18 = parseName(this,State);
                    cVar21 = '\0';
                    if (pNVar18 == (Node *)0x0) {
                      pcVar14 = (char *)0x0;
                      goto LAB_0019965d;
                    }
                  }
                  else {
                    cVar21 = '\0';
                  }
LAB_0019962c:
                  pcVar14 = (char *)BumpPointerAllocator::allocate(local_48,0x20);
                  pcVar14[8] = '$';
                  pcVar14[9] = '\x01';
                  pcVar14[10] = '\x01';
                  pcVar14[0xb] = '\x01';
                  *(undefined ***)pcVar14 = &PTR_hasRHSComponentSlow_001eb368;
                  *(NameType **)(pcVar14 + 0x10) = pNVar17;
                  pcVar14[0x18] = cVar21;
                }
                goto LAB_0019965d;
              }
              goto LAB_001995f6;
            }
            if ((pbVar6 == pbVar7) || ((ulong)((long)pbVar7 - (long)pbVar6) < 2)) goto LAB_001995f6;
            pcVar14 = (char *)0x0;
            if (*pbVar6 == 0x44) {
              if (0x35 < (ulong)pbVar6[1]) goto LAB_001995f6;
              pcVar14 = (char *)0x0;
              if ((0x27000000000000U >> ((ulong)pbVar6[1] & 0x3f) & 1) != 0) {
                this->First = (char *)(pbVar6 + 2);
                cVar21 = '\x01';
                if (State != (NameState *)0x0) {
                  State->CtorDtorConversion = true;
                }
                goto LAB_0019962c;
              }
            }
          }
LAB_0019965d:
          if (pcVar14 == (char *)0x0) {
            return (Node *)0x0;
          }
          local_50 = (NameType *)BumpPointerAllocator::allocate(local_48,0x20);
          (local_50->super_Node).K = KNestedName;
          (local_50->super_Node).RHSComponentCache = No;
          (local_50->super_Node).ArrayCache = No;
          (local_50->super_Node).FunctionCache = No;
          (local_50->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ea7b8;
          (local_50->Name).First = (char *)pNVar17;
          (local_50->Name).Last = pcVar14;
          if (State != (NameState *)0x0) {
            State->EndsWithTemplateArgs = false;
          }
          local_50 = (NameType *)parseAbiTags(this,(Node *)local_50);
          if (local_50 == (NameType *)0x0) {
            return (Node *)0x0;
          }
          goto LAB_00199449;
        }
        if ((cVar21 != 'S') || ((1 < uVar20 && (pcVar14[1] == 't')))) {
          if ((cVar21 != 'D') || ((1 < uVar20 && (pcVar14[1] == 'C')))) goto LAB_001993ee;
          goto LAB_0019945b;
        }
        pNVar15 = (NameType *)parseSubstitution(this);
        if (pNVar15 == (NameType *)0x0) {
          return (Node *)0x0;
        }
        pNVar16 = pNVar15;
        local_38 = pNVar15;
        if (pNVar17 != (NameType *)0x0) {
          pNVar16 = (NameType *)BumpPointerAllocator::allocate(local_48,0x20);
          (pNVar16->super_Node).K = KNestedName;
          (pNVar16->super_Node).RHSComponentCache = No;
          (pNVar16->super_Node).ArrayCache = No;
          (pNVar16->super_Node).FunctionCache = No;
          (pNVar16->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ea7b8;
          (pNVar16->Name).First = (char *)pNVar17;
          (pNVar16->Name).Last = (char *)pNVar15;
        }
        if (State != (NameState *)0x0) {
          State->EndsWithTemplateArgs = false;
        }
        pNVar17 = pNVar16;
        local_50 = pNVar16;
        if (pNVar16 != pNVar15) {
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                    (local_40,(Node **)&local_38);
        }
      } while( true );
    }
  }
  if (((ulong)((long)psVar4 - (long)psVar12) < 3) || ((char)psVar12[1] != 'L' || *psVar12 != 0x7453)
     ) {
    psVar12 = (short *)this->First;
    if (((ulong)((long)psVar4 - (long)psVar12) < 2) || (*psVar12 != 0x7453)) {
      pNVar17 = (NameType *)parseUnqualifiedName(this,State);
      goto LAB_00199198;
    }
    psVar12 = psVar12 + 1;
  }
  else {
    psVar12 = (short *)((long)psVar12 + 3);
  }
  this->First = (char *)psVar12;
  pNVar18 = parseUnqualifiedName(this,State);
  if (pNVar18 == (Node *)0x0) {
    pNVar17 = (NameType *)0x0;
  }
  else {
    pNVar17 = (NameType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
    (pNVar17->super_Node).K = KStdQualifiedName;
    (pNVar17->super_Node).RHSComponentCache = No;
    (pNVar17->super_Node).ArrayCache = No;
    (pNVar17->super_Node).FunctionCache = No;
    (pNVar17->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb6d8;
    (pNVar17->Name).First = (char *)pNVar18;
  }
LAB_00199198:
  if (pNVar17 != (NameType *)0x0) {
    if (this->Last == this->First) {
      return &pNVar17->super_Node;
    }
    if (*this->First != 'I') {
      return &pNVar17->super_Node;
    }
    local_50 = pNVar17;
    PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,(Node **)&local_50);
    pNVar18 = parseTemplateArgs(this,State != (NameState *)0x0);
    if (pNVar18 != (Node *)0x0) {
      if (State != (NameState *)0x0) {
        State->EndsWithTemplateArgs = true;
      }
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar13->K = KNameWithTemplateArgs;
      pNVar13->RHSComponentCache = No;
      pNVar13->ArrayCache = No;
      pNVar13->FunctionCache = No;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb680;
      pNVar13[1]._vptr_Node = (_func_int **)pNVar17;
      *(Node **)&pNVar13[1].K = pNVar18;
      return pNVar13;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseName(NameState *State) {
  consumeIf('L'); // extension

  if (look() == 'N')
    return parseNestedName(State);
  if (look() == 'Z')
    return parseLocalName(State);

  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'S' && look(1) != 't') {
    Node *S = parseSubstitution();
    if (S == nullptr)
      return nullptr;
    if (look() != 'I')
      return nullptr;
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(S, TA);
  }

  Node *N = parseUnscopedName(State);
  if (N == nullptr)
    return nullptr;
  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'I') {
    Subs.push_back(N);
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(N, TA);
  }
  //        ::= <unscoped-name>
  return N;
}